

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  undefined8 *puVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pointer *__ptr;
  int i;
  char *pcVar7;
  char *in_R9;
  pair<unsigned_long,_unsigned_long> pVar8;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  stringstream string_buffer;
  key_equal local_308;
  undefined1 local_2f8 [8];
  undefined8 local_2f0;
  AssertHelper local_2e8;
  string local_2e0;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2c0;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_238;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_1b0 [3];
  ios_base local_130 [264];
  
  local_2c0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)0x0;
  local_2c0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.id_ = 0;
  local_2e0._M_dataplus._M_p = (pointer)0x0;
  local_2e0._M_string_length = local_2e0._M_string_length & 0xffffffff00000000;
  local_1b0[0].first.super_iterator.ht._0_4_ = 0;
  local_1b0[0].first.super_iterator.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_238,0,(hasher *)&local_2c0,(key_equal *)&local_2e0,(allocator_type *)local_1b0);
  iVar5 = UniqueObjectHelper<int>(2000);
  pdVar1 = &local_238.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(pdVar1);
  local_238.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar5;
  local_238.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_deleted_ =
       true;
  iVar5 = 1;
  do {
    iVar6 = UniqueObjectHelper<int>(iVar5);
    local_2c0.
    super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ._vptr_BaseHashtableInterface =
         (_func_int **)
         CONCAT44(local_2c0.
                  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ._vptr_BaseHashtableInterface._4_4_,iVar6);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(local_1b0,
             &local_238.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_2c0);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 100);
  local_1b0[0].first.super_iterator.ht._0_4_ = UniqueObjectHelper<int>(0x38);
  local_1b0[0].first.super_iterator.ht._0_4_ = -(int)local_1b0[0].first.super_iterator.ht;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(pdVar1,(key_type *)local_1b0);
  local_1b0[0].first.super_iterator.ht._0_4_ = UniqueObjectHelper<int>(0x16);
  local_1b0[0].first.super_iterator.ht._0_4_ = -(int)local_1b0[0].first.super_iterator.ht;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(pdVar1,(key_type *)local_1b0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  bVar4 = google::
          dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::serialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                    ((dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)pdVar1);
  local_2e0._M_dataplus._M_p._0_1_ = bVar4;
  local_2e0._M_string_length = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_2c0,(internal *)&local_2e0,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &string_buffer)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x527,(char *)local_2c0.
                              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ._vptr_BaseHashtableInterface);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if (local_2c0.
        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ._vptr_BaseHashtableInterface !=
        (_func_int **)
        ((long)&local_2c0.
                super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                super_TransparentHasher + 8U)) {
      operator_delete(local_2c0.
                      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ._vptr_BaseHashtableInterface);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2f8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  sVar3 = local_2e0._M_string_length;
  if ((undefined8 *)local_2e0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2e0._M_string_length !=
        (undefined8 *)(local_2e0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2e0._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_2f8 = (undefined1  [8])0x0;
  local_2f0 = (undefined8 *)((ulong)local_2f0._4_4_ << 0x20);
  local_308.super_Hasher._0_8_ = (AssertHelperData *)0x0;
  local_308.super_Hasher.num_compares_ = 0;
  local_2e0._M_dataplus._M_p = local_2e0._M_dataplus._M_p & 0xffffffff00000000;
  local_2e0._M_string_length = 0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_2c0,0,(hasher *)local_2f8,&local_308,(allocator_type *)&local_2e0);
  pdVar1 = &local_2c0.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  bVar4 = google::
          dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::unserialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                    ((dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)pdVar1,local_1b0);
  local_2f8[0] = (internal)bVar4;
  local_2f0 = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)local_2f8,
               (AssertionResult *)
               "ht_in.unserialize(typename TypeParam::NopointerSerializer(), &string_buffer)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52b,local_2e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_308.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_308.super_Hasher._0_8_ + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(1);
  local_308.super_Hasher.id_ = iVar5;
  local_2e8.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_2e8.data_._0_4_ = -(int)local_2e8.data_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_2e0,pdVar1,(int *)&local_2e8);
  local_2e0.field_2._8_8_ = &local_2c0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2f8,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (int *)&local_308,(int *)local_2e0._M_string_length);
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2e0);
    if (local_2f0 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_2f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e0._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(99);
  local_308.super_Hasher.id_ = iVar5;
  local_2e8.data_._0_4_ = UniqueObjectHelper<int>(99);
  local_2e8.data_._0_4_ = -(int)local_2e8.data_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_2e0,pdVar1,(int *)&local_2e8);
  local_2e0.field_2._8_8_ = &local_2c0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2f8,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (int *)&local_308,(int *)local_2e0._M_string_length);
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2e0);
    if (local_2f0 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_2f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e0._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(100);
  local_2e0._M_dataplus._M_p._0_4_ = -iVar5;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(pdVar1,(int *)&local_2e0);
  bVar4 = pVar8.first == 0xffffffffffffffff;
  local_2f8[0] = (internal)bVar4;
  local_2f0 = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)local_2f8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52f,local_2e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_308.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_308.super_Hasher._0_8_ + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(0x15);
  local_308.super_Hasher.id_ = iVar5;
  local_2e8.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  local_2e8.data_._0_4_ = -(int)local_2e8.data_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_2e0,pdVar1,(int *)&local_2e8);
  local_2e0.field_2._8_8_ = &local_2c0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2f8,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (int *)&local_308,(int *)local_2e0._M_string_length);
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2e0);
    if (local_2f0 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_2f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x530,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e0._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(0x16);
  local_2e0._M_dataplus._M_p._0_4_ = -iVar5;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(pdVar1,(int *)&local_2e0);
  bVar4 = pVar8.first == 0xffffffffffffffff;
  local_2f8[0] = (internal)bVar4;
  local_2f0 = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)local_2f8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x532,local_2e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_308.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_308.super_Hasher._0_8_ + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(0x38);
  local_2e0._M_dataplus._M_p._0_4_ = -iVar5;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(pdVar1,(int *)&local_2e0);
  bVar4 = pVar8.first == 0xffffffffffffffff;
  local_2f8[0] = (internal)bVar4;
  local_2f0 = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)local_2f8,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x533,local_2e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_308.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_308.super_Hasher._0_8_ + 8))();
    }
  }
  puVar2 = local_2f0;
  if (local_2f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2f0 != local_2f0 + 2) {
      operator_delete((undefined8 *)*local_2f0);
    }
    operator_delete(puVar2);
  }
  local_2c0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c24568;
  if (local_2c0.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_2c0.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  local_238.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c24568;
  if (local_238.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_238.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}